

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O0

void __thiscall
absl::lts_20250127::Cord::InlineRep::SetTree
          (InlineRep *this,Nonnull<CordRep_*> rep,CordzUpdateScope *scope)

{
  bool bVar1;
  CordzUpdateScope *scope_local;
  Nonnull<CordRep_*> rep_local;
  InlineRep *this_local;
  
  if (rep == (Nonnull<CordRep_*>)0x0) {
    __assert_fail("rep",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.h"
                  ,0x4f6,
                  "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                 );
  }
  bVar1 = cord_internal::InlineData::is_tree(&this->data_);
  if (!bVar1) {
    __assert_fail("data_.is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.h"
                  ,0x4f7,
                  "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                 );
  }
  cord_internal::InlineData::set_tree(&this->data_,rep);
  cord_internal::CordzUpdateScope::SetCordRep(scope,rep);
  return;
}

Assistant:

inline void Cord::InlineRep::SetTree(absl::Nonnull<CordRep*> rep,
                                     const CordzUpdateScope& scope) {
  assert(rep);
  assert(data_.is_tree());
  data_.set_tree(rep);
  scope.SetCordRep(rep);
}